

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O1

void collect_jobs(pmtr_t *cfg,UT_string *sm)

{
  UT_array *pUVar1;
  code *pcVar2;
  job_t *pjVar3;
  uint pid;
  __pid_t __pid;
  pid_t pVar4;
  ulong in_RAX;
  job_t *pjVar5;
  time_t tVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char **ppcVar11;
  int es;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pid = waitpid(-1,(int *)((long)&uStack_38 + 4),1);
  if (0 < (int)pid) {
    do {
      if (pid == cfg->dm_pid) {
        if ((uStack_38._4_4_ & 0xff7f) == 0x2100) {
          pVar4 = 0;
          syslog(6,"inotify-based dependency monitoring disabled");
        }
        else {
          pVar4 = dep_monitor(cfg->file);
        }
        cfg->dm_pid = pVar4;
      }
      else if (pid == cfg->logger_pid) {
        __pid = getpid();
        kill(__pid,0xf);
      }
      else {
        pjVar5 = get_job_by_pid(cfg->jobs,pid);
        if (pjVar5 == (job_t *)0x0) {
          syslog(3,"sigchld for unknown pid %d",(ulong)pid);
        }
        else {
          pjVar5->pid = 0;
          pjVar5->terminate = 0;
          tVar6 = time((time_t *)0x0);
          lVar10 = tVar6 + 10;
          if (9 < (int)tVar6 - (int)pjVar5->start_ts) {
            lVar10 = tVar6;
          }
          pjVar5->start_at = lVar10;
          if (pjVar5->once != 0) {
            pjVar5->respawn = 0;
          }
          sm->i = 0;
          *sm->d = '\0';
          utstring_printf(sm,"job %s [%d] exited after %d sec: ",pjVar5->name,(ulong)pid);
          if (0x1ffffff < (int)((uStack_38._4_4_ & 0x7f) * 0x1000000 + 0x1000000)) {
            utstring_printf(sm,"signal %d");
          }
          if ((uStack_38 & 0x7f00000000) == 0) {
            if ((uStack_38._4_4_ >> 8 & 0xff) == 0x21) {
              pjVar5->respawn = 0;
            }
            utstring_printf(sm,"exit status %d");
          }
          syslog(6,"%s",sm->d);
          if (pjVar5->delete_when_collected != 0) {
            pUVar1 = cfg->jobs;
            pcVar2 = (code *)(pUVar1->icd).dtor;
            if (pcVar2 != (code *)0x0) {
              pjVar3 = (job_t *)pUVar1->d;
              uVar7 = 0xffffffffffffffff;
              if (pjVar3 <= pjVar5) {
                uVar7 = (ulong)((long)pjVar5 - (long)pjVar3) / (pUVar1->icd).sz;
              }
              if (uVar7 < pUVar1->i) {
                uVar7 = (pUVar1->icd).sz;
                uVar8 = 0xffffffffffffffff;
                if (pjVar3 <= pjVar5) {
                  uVar8 = (ulong)((long)pjVar5 - (long)pjVar3) / uVar7;
                }
                ppcVar11 = (char **)((long)&pjVar3->name + uVar8 * uVar7);
              }
              else {
                ppcVar11 = (char **)0x0;
              }
              (*pcVar2)(ppcVar11);
            }
            pUVar1 = cfg->jobs;
            pjVar3 = (job_t *)pUVar1->d;
            if (pjVar5 < pjVar3) {
              uVar7 = 0;
            }
            else {
              uVar7 = (ulong)((long)pjVar5 - (long)pjVar3) / (pUVar1->icd).sz + 1;
            }
            if (uVar7 < pUVar1->i) {
              uVar7 = (pUVar1->icd).sz;
              uVar8 = 0xffffffffffffffff;
              if (pjVar3 <= pjVar5) {
                uVar8 = (ulong)((long)pjVar5 - (long)pjVar3) / uVar7;
              }
              if (pjVar5 < pjVar3) {
                lVar10 = 0;
              }
              else {
                lVar10 = (ulong)((long)pjVar5 - (long)pjVar3) / uVar7 + 1;
              }
              if (pjVar5 < pjVar3) {
                uVar9 = 0;
              }
              else {
                uVar9 = ~((ulong)((long)pjVar5 - (long)pjVar3) / uVar7);
              }
              memmove((char **)((long)&pjVar3->name + uVar8 * uVar7),
                      (char **)((long)&pjVar3->name + lVar10 * uVar7),(uVar9 + pUVar1->i) * uVar7);
            }
            cfg->jobs->i = cfg->jobs->i - 1;
          }
        }
      }
      pid = waitpid(-1,(int *)((long)&uStack_38 + 4),1);
    } while (0 < (int)pid);
  }
  return;
}

Assistant:

void collect_jobs(pmtr_t *cfg, UT_string *sm) {
  int es, ex, elapsed;
  time_t now;
  job_t *job;
  pid_t pid;

  while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {

    /* respawn if it's our dependency monitor, unless its flagged */
    if (pid==cfg->dm_pid) { 
      if (WIFEXITED(es) && ((WEXITSTATUS(es)) == PMTR_NO_RESTART)) {
        syslog(LOG_INFO, "inotify-based dependency monitoring disabled");
        cfg->dm_pid = 0;
      } else {
        cfg->dm_pid = dep_monitor(cfg->file);
      }
      continue;
    }
    /* if it's our logger sub process ... */
    if (pid==cfg->logger_pid) { 
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      continue;
    }
    /* find the job.  we should always find it by pid. */
    job = get_job_by_pid(cfg->jobs, pid);
    if (!job) {
      syslog(LOG_ERR,"sigchld for unknown pid %d",(int)pid); 
      continue;
    }
    /* decide if and when it should be restarted */
    job->pid = 0;
    job->terminate = 0; /* any termination request has succeeded */
    now = time(NULL);
    elapsed = now - job->start_ts;
    job->start_at = (elapsed < SHORT_DELAY) ? (now+SHORT_DELAY) : now;
    if (job->once) job->respawn=0;

    /* write a log message about how the job exited */
    utstring_clear(sm);
    utstring_printf(sm,"job %s [%d] exited after %d sec: ", job->name, 
      (int)pid, elapsed);
    if (WIFSIGNALED(es)) utstring_printf(sm, "signal %d", (int)WTERMSIG(es));
    if (WIFEXITED(es)) {
      if ( (ex = WEXITSTATUS(es)) == PMTR_NO_RESTART) job->respawn=0;
      utstring_printf(sm,"exit status %d", ex);
    }
    syslog(LOG_INFO,"%s",utstring_body(sm));

    /* is this a former job that was deleted from the config file? */
    if (job->delete_when_collected) {
      utarray_erase(cfg->jobs, utarray_eltidx(cfg->jobs,job), 1);
      job=NULL;
    }
  }
}